

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_peek.c
# Opt level: O3

ssize_t mpt_queue_peek(mpt_decode_queue *qu,size_t max,void *dst)

{
  size_t *psVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  mpt_data_decoder_t p_Var8;
  size_t sVar9;
  ulong uVar10;
  iovec src;
  mpt_message local_58;
  iovec local_38;
  
  uVar6 = (qu->data).len;
  uVar5 = 0xfffffffffffffff0;
  if (uVar6 != 0) {
    pvVar2 = (qu->data).base;
    sVar9 = (qu->data).off;
    local_58.base = (void *)((long)pvVar2 + sVar9);
    uVar7 = (qu->data).max - sVar9;
    local_58.cont = (iovec *)0x0;
    sVar9 = uVar6 - uVar7;
    local_58.used = uVar6;
    if (uVar7 <= uVar6 && sVar9 != 0) {
      local_58.cont = &local_38;
      local_58.used = uVar7;
      local_38.iov_base = pvVar2;
      local_38.iov_len = sVar9;
    }
    local_58.clen = (size_t)(uVar7 <= uVar6 && sVar9 != 0);
    uVar7 = (qu->_state).data.pos;
    p_Var8 = qu->_dec;
    if (p_Var8 == (mpt_data_decoder_t)0x0) {
      uVar4 = (uint)(qu->_state).data.msg;
      uVar10 = 0;
      if (-1 < (int)uVar4) {
        uVar10 = (ulong)(uVar4 & 0x7fffffff);
      }
      uVar10 = uVar10 + uVar7;
      if (dst == (void *)0x0) {
        iVar3 = (int)uVar6 - (int)uVar10;
        if (-1 < iVar3) {
          uVar5 = (long)iVar3;
        }
      }
      else {
        if ((uVar10 != 0) &&
           (sVar9 = mpt_message_read(&local_58,uVar10,(void *)0x0), sVar9 < uVar10)) {
          return -0x10;
        }
        uVar5 = mpt_message_read(&local_58,max,dst);
      }
    }
    else {
      uVar6 = (qu->_state).curr;
      uVar5 = uVar7;
      if (uVar6 < uVar7) {
        uVar5 = uVar6;
      }
      if (uVar5 != 0) {
        sVar9 = mpt_message_read(&local_58,uVar5,(void *)0x0);
        if (sVar9 < uVar5) {
          return -0x10;
        }
        uVar6 = (qu->_state).curr;
        uVar7 = (qu->_state).data.pos;
        p_Var8 = qu->_dec;
      }
      (qu->_state).data.pos = uVar7 - uVar5;
      (qu->_state).curr = uVar6 - uVar5;
      local_38.iov_base = local_58.base;
      local_38.iov_len = local_58.used;
      iVar3 = (*p_Var8)(&qu->_state,&local_38,0);
      sVar9 = (qu->_state).data.pos;
      local_58.base = (void *)((long)local_58.base + sVar9);
      (qu->_state).data.pos = sVar9 + uVar5;
      psVar1 = &(qu->_state).curr;
      *psVar1 = *psVar1 + uVar5;
      uVar5 = (qu->_state).data.len;
      if ((dst != (void *)0x0) && (-1 < iVar3)) {
        if (max <= uVar5) {
          uVar5 = max;
        }
        memcpy(dst,local_58.base,uVar5);
      }
    }
  }
  return uVar5;
}

Assistant:

extern ssize_t mpt_queue_peek(MPT_STRUCT(decode_queue) *qu, size_t max, void *dst)
{
	MPT_STRUCT(message) msg;
	struct iovec src;
	size_t off, len;
	int ret;
	
	if (!(len = qu->data.len)) {
		return MPT_ERROR(MissingData);
	}
	off = qu->data.off;
	msg.base = ((uint8_t *) qu->data.base) + off;
	
	/* message setup */
	if (len > (qu->data.max - off)) {
		msg.used = qu->data.max - off;
		msg.clen = 1;
		msg.cont = &src;
		src.iov_base = qu->data.base;
		src.iov_len  = len - msg.used;
	} else {
		msg.used = len;
		msg.clen = 0;
		msg.cont = 0;
	}
	off = qu->_state.data.pos;
	
	/* final data available */
	if (!qu->_dec) {
		if ((ret = qu->_state.data.msg) >= 0) {
			off += ret;
		}
		if (!dst) {
			ret = len - off;
			return ret >= 0 ? ret : MPT_ERROR(MissingData);
		}
		if (off && (mpt_message_read(&msg, off, 0) < off)) {
			return MPT_ERROR(MissingData);
		}
		return mpt_message_read(&msg, max, dst);
	}
	/* work area reduces offset */
	len = qu->_state.curr;
	if (len < off) {
		off = len;
	}
	if (off && (mpt_message_read(&msg, off, 0) < off)) {
		return MPT_ERROR(MissingData);
	}
	src.iov_base = (void *) msg.base;
	src.iov_len  = msg.used;
	
	/* reduce wrap size */
	qu->_state.data.pos -= off;
	qu->_state.curr -= off;
	/* peek for new data */
	ret = qu->_dec(&qu->_state, &src, 0);
	len = qu->_state.data.pos;
	msg.base = (uint8_t *) msg.base + len;
	/* restore offsets */
	qu->_state.data.pos = len + off;
	qu->_state.curr += off;
	len = qu->_state.data.len;
	
	if (ret < 0 || !dst) {
		return len;
	}
	/* get data start and length */
	if (len > max) {
		len = max;
	}
	(void) memcpy(dst, msg.base, len);
	
	return len;
}